

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_registry.c
# Opt level: O2

_Bool upb_ExtensionRegistry_AddAllLinkedExtensions(upb_ExtensionRegistry *r)

{
  _Bool _Var1;
  upb_MiniTableExtension *p;
  upb_MiniTableExtension *e;
  
  for (e = UPB_linkarr_internal_empty_upb_AllExts; e < (upb_MiniTableExtension *)&completed_0;
      e = e + 1) {
    if ((e->field_dont_copy_me__upb_internal_use_only).number_dont_copy_me__upb_internal_use_only !=
        0) {
      _Var1 = upb_ExtensionRegistry_Add(r,e);
      if (!_Var1) break;
    }
  }
  return (upb_MiniTableExtension *)
         ((long)&UPB_linkarr_internal_empty_upb_AllExts[0].sub_dont_copy_me__upb_internal_use_only +
         7) < e;
}

Assistant:

bool upb_ExtensionRegistry_AddAllLinkedExtensions(upb_ExtensionRegistry* r) {
  const upb_MiniTableExtension* start = UPB_LINKARR_START(upb_AllExts);
  const upb_MiniTableExtension* stop = UPB_LINKARR_STOP(upb_AllExts);
  for (const upb_MiniTableExtension* p = start; p < stop; p++) {
    // Windows can introduce zero padding, so we have to skip zeroes.
    if (upb_MiniTableExtension_Number(p) != 0) {
      if (!upb_ExtensionRegistry_Add(r, p)) return false;
    }
  }
  return true;
}